

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-model-base-flex-estimation.hxx
# Opt level: O1

IndexedVectorArray *
stateObservation::examples::offlineModelBaseFlexEstimation
          (IndexedVectorArray *__return_storage_ptr__,IndexedVectorArray *y,IndexedVectorArray *u,
          Matrix *xh0,IndexedVectorArray *numberOfContacts,double dt,double mass,bool withForce,
          IndexedMatrixArray *Q,IndexedMatrixArray *R,Matrix3 *kfe,Matrix3 *kfv,Matrix3 *kte,
          Matrix3 *ktv,IndexedVectorArray *prediction,IndexedVectorArray *ino,
          IndexedVectorArray *premea,IndexedVectorArray *simumea,int verbose)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Map_pointer ppMVar6;
  _Map_pointer ppMVar7;
  _Elt_pointer pMVar8;
  DenseStorage<double,__1,__1,__1,_0> *pDVar9;
  ostream *poVar10;
  DenseStorage<double,__1,__1,_1,_0> *pDVar11;
  long lVar12;
  char *__function;
  long lVar13;
  ulong uVar14;
  IndexedVectorArray *xh;
  ModelBaseEKFFlexEstimatorIMU estimator;
  long local_17f8;
  Matrix<double,__1,_1,_0,__1,_1> local_17f0;
  IndexedVectorArray *local_17e0;
  DenseStorage<double,__1,__1,__1,_0> local_17d8;
  DenseStorage<double,__1,__1,_1,_0> *local_17c0;
  undefined8 local_17b8;
  long local_17a8;
  double local_17a0;
  double local_1798;
  IndexedVectorArray *local_1790;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_1788;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_1780;
  Deque *local_1778;
  DenseStorage<double,__1,__1,_1,_0> local_1770;
  long local_1760;
  ModelBaseEKFFlexEstimatorIMU local_1758 [5928];
  
  local_17e0 = numberOfContacts;
  local_17a0 = mass;
  local_1798 = dt;
  local_1790 = __return_storage_ptr__;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(local_1758,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel
            ((uint)local_1758);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod
            (local_1798);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(local_17a0);
  local_1780 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                *)(Q + 0x18);
  if ((*(long *)(Q + 0x28) - *(long *)(Q + 0x18) >> 3) * -0x5555555555555555 +
      (*(long *)(Q + 0x38) - *(long *)(Q + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(Q + 0x50) - *(long *)(Q + 0x30) >> 3) + -1 + (ulong)(*(long *)(Q + 0x50) == 0)) *
      0x15 == 1) {
    pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_1780,0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d8,pDVar9);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
              ((Matrix *)local_1758);
    free(local_17d8.m_data);
  }
  local_1788 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                *)(R + 0x18);
  if ((*(long *)(R + 0x28) - *(long *)(R + 0x18) >> 3) * -0x5555555555555555 +
      (*(long *)(R + 0x38) - *(long *)(R + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(R + 0x50) - *(long *)(R + 0x30) >> 3) + -1 + (ulong)(*(long *)(R + 0x50) == 0)) *
      0x15 == 1) {
    pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_1788,0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d8,pDVar9);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
    setMeasurementNoiseCovariance((Matrix *)local_1758);
    free(local_17d8.m_data);
  }
  lVar13 = *(long *)(Q + 0x50);
  lVar12 = *(long *)(Q + 0x30);
  lVar2 = *(long *)(Q + 0x38);
  lVar3 = *(long *)(Q + 0x40);
  local_1798 = (double)(*(long *)(Q + 0x28) - *(long *)(Q + 0x18));
  lVar4 = *(long *)(R + 0x50);
  lVar5 = *(long *)(R + 0x30);
  local_1760 = *(long *)(R + 0x38) - *(long *)(R + 0x40);
  local_17a0 = (double)(*(long *)(R + 0x28) - *(long *)(R + 0x18));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setFlexibilityGuess
            ((Matrix *)local_1758);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(local_1758,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(local_1758,0));
  if ((((((((*(double *)kfe != 0.0) || (NAN(*(double *)kfe))) || (*(double *)(kfe + 8) != 0.0)) ||
         ((NAN(*(double *)(kfe + 8)) || (*(double *)(kfe + 0x10) != 0.0)))) ||
        (NAN(*(double *)(kfe + 0x10)))) ||
       (((*(double *)(kfe + 0x18) != 0.0 || (NAN(*(double *)(kfe + 0x18)))) ||
        ((*(double *)(kfe + 0x20) != 0.0 ||
         (((NAN(*(double *)(kfe + 0x20)) || (*(double *)(kfe + 0x28) != 0.0)) ||
          (NAN(*(double *)(kfe + 0x28)))))))))) ||
      ((*(double *)(kfe + 0x30) != 0.0 || (NAN(*(double *)(kfe + 0x30)))))) ||
     ((*(double *)(kfe + 0x38) != 0.0 ||
      (((NAN(*(double *)(kfe + 0x38)) || (*(double *)(kfe + 0x40) != 0.0)) ||
       (NAN(*(double *)(kfe + 0x40)))))))) {
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte
              ((Matrix *)local_1758);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv
              ((Matrix *)local_1758);
  }
  local_1778 = &local_1790->v_;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1790->k_ = 0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (local_1790->v_).
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::_M_initialize_map(&local_1778->
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ,0);
  if (0 < y->k_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_17d8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)xh0);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(local_1790,(Matrix<double,__1,_1,_0,__1,_1> *)&local_17d8,y->k_ + -1);
    free(local_17d8.m_data);
  }
  local_1798 = (double)(((long)local_1798 >> 3) * -0x5555555555555555 +
                        (lVar2 - lVar3 >> 3) * -0x5555555555555555 +
                       ((lVar13 - lVar12 >> 3) + -1 + (ulong)(lVar13 == 0)) * 0x15);
  local_17a0 = (double)(((long)local_17a0 >> 3) * -0x5555555555555555 +
                        (local_1760 >> 3) * -0x5555555555555555 +
                       ((lVar4 - lVar5 >> 3) + -1 + (ulong)(lVar4 == 0)) * 0x15);
  lVar13 = y->k_;
  local_17f8 = lVar13 << 4;
  while( true ) {
    ppMVar6 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if ((long)(((long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(y->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) + y->k_ +
              ((long)(y->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)(y->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
              ((((ulong)((long)ppMVar6 -
                        (long)(y->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20) <= lVar13) {
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      ~ModelBaseEKFFlexEstimatorIMU(local_1758);
      return local_1790;
    }
    ppMVar6 = (local_17e0->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar7 = (local_17e0->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar8 = (local_17e0->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar12 = ((long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
             ((long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
             (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar12 == 0) || (lVar2 = local_17e0->k_, lVar13 < lVar2)) || (lVar12 + lVar2 <= lVar13))
    break;
    lVar12 = ((long)pMVar8 -
              (long)(local_17e0->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
    uVar1 = lVar12 + lVar13;
    if (uVar1 < 0x20) {
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar8[-lVar2].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    else {
      uVar14 = uVar1 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar1) {
        uVar14 = uVar1 >> 5;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
    if (local_17d8.m_rows < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    round(*local_17d8.m_data);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
              ((uint)local_1758);
    free(local_17d8.m_data);
    if ((0 < verbose) && ((verbose != 1 || (lVar13 == (lVar13 / 1000) * 1000)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iteration: ",0xb);
      poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if (2 < verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"number of contacts: ",0x14);
        ppMVar6 = (local_17e0->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppMVar7 = (local_17e0->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pMVar8 = (local_17e0->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar12 = ((long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
                 ((long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                 (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
        if (((lVar12 != 0) && (lVar2 = local_17e0->k_, lVar2 <= lVar13)) &&
           (lVar13 < lVar12 + lVar2)) {
          lVar12 = ((long)pMVar8 -
                    (long)(local_17e0->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
          uVar1 = lVar12 + lVar13;
          if (uVar1 < 0x20) {
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      ((long)&pMVar8[-lVar2].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + local_17f8);
          }
          else {
            uVar14 = uVar1 >> 5 | 0xf800000000000000;
            if (0 < (long)uVar1) {
              uVar14 = uVar1 >> 5;
            }
            pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                      (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
          poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &local_17d8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          free(local_17d8.m_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"size of the measurement: ",0x19);
          ppMVar6 = (y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppMVar7 = (y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          pMVar8 = (y->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          lVar12 = ((long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
                   ((long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                   (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
          if (((lVar12 != 0) && (lVar2 = y->k_, lVar2 <= lVar13)) && (lVar13 < lVar12 + lVar2)) {
            lVar12 = ((long)pMVar8 -
                      (long)(y->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
            uVar1 = lVar12 + lVar13;
            if (uVar1 < 0x20) {
              pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                        ((long)&pMVar8[-lVar2].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + local_17f8);
            }
            else {
              uVar14 = uVar1 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar1) {
                uVar14 = uVar1 >> 5;
              }
              pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                      ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
            poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", supposed to be ",0x11);
            stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getMeasurementSize();
            poVar10 = std::ostream::_M_insert<long>((long)poVar10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            free(local_17d8.m_data);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"size of the input: ",0x13);
            ppMVar6 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
            ppMVar7 = (u->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            pMVar8 = (u->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            lVar12 = ((long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
                     ((long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)(u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                     (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
            if (((lVar12 != 0) && (lVar2 = u->k_, lVar2 <= lVar13)) && (lVar13 < lVar12 + lVar2)) {
              lVar12 = ((long)pMVar8 -
                        (long)(u->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
              uVar1 = lVar12 + lVar13;
              if (uVar1 < 0x20) {
                pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                          ((long)&pMVar8[-lVar2].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + local_17f8);
              }
              else {
                uVar14 = uVar1 >> 5 | 0xf800000000000000;
                if (0 < (long)uVar1) {
                  uVar14 = uVar1 >> 5;
                }
                pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                          (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
              }
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
              poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", supposed to be ",0x11);
              stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
              poVar10 = std::ostream::_M_insert<long>((long)poVar10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              free(local_17d8.m_data);
              if (verbose == 3) goto LAB_00105496;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"numberOfContacts: ",0x12);
              ppMVar6 = (local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node;
              ppMVar7 = (local_17e0->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node;
              pMVar8 = (local_17e0->v_).
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar12 = ((long)(local_17e0->v_).
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4)
                       + ((long)(local_17e0->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(local_17e0->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                         ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                         (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
              if (((lVar12 != 0) && (lVar2 = local_17e0->k_, lVar2 <= lVar13)) &&
                 (lVar13 < lVar12 + lVar2)) {
                lVar12 = ((long)pMVar8 -
                          (long)(local_17e0->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
                uVar1 = lVar12 + lVar13;
                if (uVar1 < 0x20) {
                  pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                            ((long)&pMVar8[-lVar2].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data + local_17f8);
                }
                else {
                  uVar14 = uVar1 >> 5 | 0xf800000000000000;
                  if (0 < (long)uVar1) {
                    uVar14 = uVar1 >> 5;
                  }
                  pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                            (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
                }
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                          ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
                local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)&local_17d8;
                poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                            (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                             *)&local_17f0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                free(local_17d8.m_data);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Measurement: ",0xd);
                ppMVar6 = (y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node;
                ppMVar7 = (y->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node;
                pMVar8 = (y->v_).
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
                lVar12 = ((long)(y->v_).
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4
                         ) + ((long)(y->v_).
                                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)(y->v_).
                                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                             ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                             (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
                if (((lVar12 != 0) && (lVar2 = y->k_, lVar2 <= lVar13)) && (lVar13 < lVar12 + lVar2)
                   ) {
                  lVar12 = ((long)pMVar8 -
                            (long)(y->v_).
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
                  uVar1 = lVar12 + lVar13;
                  if (uVar1 < 0x20) {
                    pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                              ((long)&pMVar8[-lVar2].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data + local_17f8);
                  }
                  else {
                    uVar14 = uVar1 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar1) {
                      uVar14 = uVar1 >> 5;
                    }
                    pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                              (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
                  }
                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                            ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
                  local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data = (double *)&local_17d8;
                  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                               *)&local_17f0);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  free(local_17d8.m_data);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Input: ",7);
                  ppMVar6 = (u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node;
                  ppMVar7 = (u->v_).
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node;
                  pMVar8 = (u->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  lVar12 = ((long)(u->v_).
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >>
                           4) + ((long)(u->v_).
                                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(u->v_).
                                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                                ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
                                (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
                  if (((lVar12 != 0) && (lVar2 = u->k_, lVar2 <= lVar13)) &&
                     (lVar13 < lVar12 + lVar2)) {
                    lVar12 = ((long)pMVar8 -
                              (long)(u->v_).
                                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
                    uVar1 = lVar12 + lVar13;
                    if (uVar1 < 0x20) {
                      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                                ((long)&pMVar8[-lVar2].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data + local_17f8);
                    }
                    else {
                      uVar14 = uVar1 >> 5 | 0xf800000000000000;
                      if (0 < (long)uVar1) {
                        uVar14 = uVar1 >> 5;
                      }
                      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                                (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
                    }
                    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
                    local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data = (double *)&local_17d8;
                    poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                                (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                 *)&local_17f0);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10)
                    ;
                    std::ostream::put((char)poVar10);
                    std::ostream::flush();
                    free(local_17d8.m_data);
                    goto LAB_00105496;
                  }
                }
              }
            }
          }
        }
        break;
      }
    }
LAB_00105496:
    ppMVar6 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar7 = (y->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar8 = (y->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar12 = ((long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
             ((long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
             (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar12 == 0) || (lVar2 = y->k_, lVar13 < lVar2)) || (lVar12 + lVar2 <= lVar13)) break;
    lVar12 = ((long)pMVar8 -
              (long)(y->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
    uVar1 = lVar12 + lVar13;
    if (uVar1 < 0x20) {
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar8[-lVar2].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    else {
      uVar14 = uVar1 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar1) {
        uVar14 = uVar1 >> 5;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1770,pDVar11);
    local_17d8.m_rows =
         stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMeasurementSize()
    ;
    local_17d8.m_data = local_1770.m_data;
    if (local_17d8.m_rows < 0 && local_1770.m_data != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    local_17c0 = &local_1770;
    local_17b8 = 0;
    local_17a8 = local_1770.m_rows;
    if ((local_17d8.m_rows < 0) || (local_1770.m_rows < local_17d8.m_rows)) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_17f0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_17d8);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)local_1758);
    free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    free(local_1770.m_data);
    ppMVar6 = (u->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppMVar7 = (u->v_).
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    pMVar8 = (u->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar12 = ((long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 4) +
             ((long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppMVar6 - (long)ppMVar7) >> 3) - 1) +
             (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x20;
    if (((lVar12 == 0) || (lVar2 = u->k_, lVar13 < lVar2)) || (lVar12 + lVar2 <= lVar13)) break;
    lVar12 = ((long)pMVar8 -
              (long)(u->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - lVar2;
    uVar1 = lVar12 + lVar13;
    if (uVar1 < 0x20) {
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                ((long)&pMVar8[-lVar2].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + local_17f8);
    }
    else {
      uVar14 = uVar1 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar1) {
        uVar14 = uVar1 >> 5;
      }
      pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
                (ppMVar7[uVar14] + lVar12 + uVar14 * -0x20 + lVar13);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)local_1758);
    free(local_17d8.m_data);
    if (1 < (long)local_1798) {
      lVar12 = (*(long *)(Q + 0x28) - *(long *)(Q + 0x18) >> 3) * -0x5555555555555555 +
               (*(long *)(Q + 0x38) - *(long *)(Q + 0x40) >> 3) * -0x5555555555555555 +
               ((*(long *)(Q + 0x50) - *(long *)(Q + 0x30) >> 3) + -1 +
               (ulong)(*(long *)(Q + 0x50) == 0)) * 0x15;
      if (((lVar12 != 0) && (lVar2 = *(long *)Q, lVar2 <= lVar13)) && (lVar13 < lVar12 + lVar2)) {
        pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
                 std::
                 _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                 ::operator[](local_1780,lVar13 - lVar2);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d8,pDVar9);
        stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
        setProcessNoiseCovariance((Matrix *)local_1758);
        free(local_17d8.m_data);
        goto LAB_001057a1;
      }
LAB_00105a75:
      __function = 
      "void stateObservation::IndexedMatrixArrayT<>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
      ;
      goto LAB_00105a8a;
    }
LAB_001057a1:
    if (1 < (long)local_17a0) {
      lVar12 = (*(long *)(R + 0x28) - *(long *)(R + 0x18) >> 3) * -0x5555555555555555 +
               (*(long *)(R + 0x38) - *(long *)(R + 0x40) >> 3) * -0x5555555555555555 +
               ((*(long *)(R + 0x50) - *(long *)(R + 0x30) >> 3) + -1 +
               (ulong)(*(long *)(R + 0x50) == 0)) * 0x15;
      if (((lVar12 == 0) || (lVar2 = *(long *)R, lVar13 < lVar2)) || (lVar12 + lVar2 <= lVar13))
      goto LAB_00105a75;
      pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
               std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_1788,lVar13 - lVar2);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_17d8,pDVar9);
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
      setMeasurementNoiseCovariance((Matrix *)local_1758);
      free(local_17d8.m_data);
    }
    pDVar11 = (DenseStorage<double,__1,__1,_1,_0> *)
              stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
              getFlexibilityVector();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_17d8,pDVar11);
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(local_1778,(value_type *)&local_17d8);
    if (prediction != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getLastPrediction();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(prediction,&local_17f0,lVar13);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (ino != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getInnovation();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(ino,&local_17f0,lVar13);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (premea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::
      getLastPredictedMeasurement();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(premea,&local_17f0,lVar13);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (simumea != (IndexedVectorArray *)0x0) {
      stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getSimulatedMeasurement
                ();
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(simumea,&local_17f0,lVar13);
      free(local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
    }
    if (1 < verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success",7);
      if (verbose != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", rebuilt state ",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        local_17f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)&local_17d8;
        Eigen::operator<<((ostream *)&std::cout,
                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                          &local_17f0);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    free(local_17d8.m_data);
    lVar13 = lVar13 + 1;
    local_17f8 = local_17f8 + 0x10;
  }
  __function = 
  "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
  ;
LAB_00105a8a:
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x192,__function);
}

Assistant:

stateObservation::IndexedVectorArray offlineModelBaseFlexEstimation(
  const stateObservation::IndexedVectorArray & y,
  const stateObservation::IndexedVectorArray & u,
  const Matrix & xh0,
  const stateObservation::IndexedVectorArray numberOfContacts,
  double dt,
  double mass,
  bool withForce,
  const stateObservation::IndexedMatrixArray & Q,
  const stateObservation::IndexedMatrixArray & R,
  const Matrix3 & kfe,
  const Matrix3 & kfv,
  const Matrix3 & kte,
  const Matrix3 & ktv,
  IndexedVectorArray * prediction,
  IndexedVectorArray * ino,
  IndexedVectorArray * premea,
  IndexedVectorArray * simumea,
  int verbose)
{


  flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU estimator;

  estimator.setContactModel(flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::contactModel::elasticContact);
  estimator.setSamplingPeriod(dt);
  estimator.setRobotMass(mass);

  bool customQ = false,
       customR = false;

  if (Q.size()==1)
  {
    estimator.setProcessNoiseCovariance(Q[Q.getFirstIndex()]);
  }
  if (R.size()==1)
  {
    estimator.setMeasurementNoiseCovariance(R[R.getFirstIndex()]);
  }

  if (Q.size()>1)
  {
    customQ=true;
  }
  if (R.size()>1)
  {
    customR=true;
  }



//  Matrix Ri,Qi,P;
//
//  int measurementSize=6;
//  int stateSize=flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::size;
//
//  double acceleroCovariance=acc_cov_const;
//  double gyroCovariance=gyr_cov_const;
//  double posStateCov=pos_state_cov_const;
//  double oristateCov=ori_state_cov_const;
//  double velStateCov=vel_state_cov_const;
//  double angvStateCov=angv_state_cov_const;
//  double stateForceCov=state_fc_const;



//  Ri.noalias()=Matrix::Identity(measurementSize,measurementSize)*acceleroCovariance;
//  Ri(3,3)=R(4,4)=R(5,5)=gyroCovariance;
//  Qi.noalias()=Matrix::Identity(stateSize,stateSize)*posStateCov;
//
//  Qi.diagonal().segment<3>(state::ori).setConstant(oristateCov);
//
//  Qi.diagonal().segment<3>(state::linVel).setConstant(velStateCov);
//  Qi.diagonal().segment<3>(state::angVel).setConstant(angvStateCov);
//  Qi.diagonal().segment<12>(state::fc).setConstant(stateForceCov);
//
//  estimator.setProcessNoiseCovariance(Qi);
//  estimator.setMeasurementNoiseCovariance(Ri);
//  Matrix forcevariance= Matrix::Identity(6,6)*force_sensor_const;
//  forcevariance.block(3,3,3,3)=Matrix::Identity(3,3)*torque_sensor_const;
//  /// consider the vertical torque as reliable as a force
//  forcevariance(2,2)=torque_sensor_const;
//  /// consider the vertical force as reliable as torque
//  forcevariance(6,6)=force_sensor_const;
//  estimator.setForceVariance(forcevariance);



  estimator.setFlexibilityGuess(xh0);

  estimator.setWithUnmodeledForces(true);


  estimator.setWithForcesMeasurements(withForce);


  if (kfe!=Matrix3::Zero())
  {
    estimator.setKfe(kfe);
    estimator.setKfv(kfv);
    estimator.setKte(kte);
    estimator.setKtv(ktv);
  }

  ///the array of the state estimations over time
  stateObservation::IndexedVectorArray xh;
  if (y.getFirstIndex()>0)
    xh.setValue(xh0,y.getFirstIndex()-1);

  ///the reconstruction of the state
  for (TimeIndex i=y.getFirstIndex(); i<y.getNextIndex(); ++i)
  {

    estimator.setContactsNumber(unsigned(round(numberOfContacts[i](0))));

    if (verbose>0)
    {
      if (i%1000==0 || verbose >1)
      {
        std::cout << "iteration: " << i  << std::endl ;

        if (verbose >2)
        {
          std::cout << "number of contacts: "<< numberOfContacts[i]<< std::endl;
          std::cout << "size of the measurement: "<< y[i].size()
                    << ", supposed to be " << estimator.getMeasurementSize() << std::endl;
          std::cout << "size of the input: "<< u[i].size()
                    << ", supposed to be " << estimator.getInputSize() << std::endl;

          if (verbose > 3)
          {
            std::cout << "numberOfContacts: " << numberOfContacts[i].transpose() << std::endl;
            std::cout << "Measurement: " << y[i].transpose() << std::endl;
            std::cout << "Input: " << u[i].transpose() << std::endl;
          }
        }
      }
    }

    ///introduction of the measurement
    estimator.setMeasurement(Vector(y[i]).head(estimator.getMeasurementSize()));

    estimator.setMeasurementInput(u[i]);

    ///initialize flexibility
    if (customQ)
    {
      estimator.setProcessNoiseCovariance(Q[i]);
    }

    if (customR)
    {
      estimator.setMeasurementNoiseCovariance(R[i]);
    }

    ///get the estimation and give it to the array
    Vector xhk=estimator.getFlexibilityVector();

    xh.pushBack(xhk);

    if (prediction != 0x0)
    {
      prediction->setValue(estimator.getLastPrediction(),i);
    }

    if (ino != 0x0)
    {
      ino->setValue(estimator.getInnovation(),i);
    }

    if (premea != 0x0)
    {
      premea->setValue(estimator.getLastPredictedMeasurement(),i);
    }

    if (simumea != 0x0)
    {
      simumea->setValue(estimator.getSimulatedMeasurement(),i);
    }

    if (verbose >1)
    {
      std::cout << "Success";
      if (verbose >2)
      {
        std::cout << ", rebuilt state "<<std::endl;
        std::cout << xhk.transpose();
      }

      std::cout<<std::endl;

    }

  }

  return xh;
}